

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O0

slReturn ubxEnableNMEAMsg(int fdPort,int verbosity,nmeaMSG messageID,_Bool enable)

{
  ubxMsg msg;
  errInfo error;
  _Bool _Var1;
  errorInfo_slReturn local_68;
  slReturn local_48;
  slReturn nmeaResp;
  ubxMsg nmeaMsg;
  slBuffer *body;
  _Bool enable_local;
  nmeaMSG messageID_local;
  int verbosity_local;
  int fdPort_local;
  
  nmeaMsg._16_8_ = create_slBuffer(8,LittleEndian);
  put_uint8_slBuffer((slBuffer *)nmeaMsg._16_8_,0,0xf0);
  put_uint8_slBuffer((slBuffer *)nmeaMsg._16_8_,1,(uint8_t)messageID);
  put_uint8_slBuffer((slBuffer *)nmeaMsg._16_8_,2,'\0');
  put_uint8_slBuffer((slBuffer *)nmeaMsg._16_8_,3,enable);
  put_uint8_slBuffer((slBuffer *)nmeaMsg._16_8_,4,'\0');
  put_uint8_slBuffer((slBuffer *)nmeaMsg._16_8_,5,'\0');
  put_uint8_slBuffer((slBuffer *)nmeaMsg._16_8_,6,'\0');
  put_uint8_slBuffer((slBuffer *)nmeaMsg._16_8_,7,'\0');
  createUbxMsg((ubxMsg *)&nmeaResp,ut_CFG_MSG,(slBuffer *)nmeaMsg._16_8_);
  msg.body = (slBuffer *)nmeaMsg._0_8_;
  msg._0_8_ = nmeaResp;
  msg._16_8_ = nmeaMsg.body;
  local_48 = sendUbxAckedMsg(fdPort,msg);
  _Var1 = isErrorReturn(local_48);
  if (_Var1) {
    createErrorInfo(&local_68,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c",
                    "ubxEnableNMEAMsg",0x197,local_48);
    error.fileName = local_68.fileName;
    error.cause = local_68.cause;
    error.functionName = local_68.functionName;
    error.lineNumber = local_68.lineNumber;
    error._28_4_ = local_68._28_4_;
    _verbosity_local = makeErrorMsgReturn(error,"failed to enable /disable NMEA MSG");
  }
  else {
    free((void *)nmeaMsg._16_8_);
    _verbosity_local = makeOkReturn();
  }
  return _verbosity_local;
}

Assistant:

extern slReturn ubxEnableNMEAMsg(int fdPort, int verbosity, nmeaMSG messageID, bool enable) {
    // construct the configuration message...
    slBuffer* body = create_slBuffer(8, LittleEndian);

    put_uint8_slBuffer(body,  0, 0xf0);             //  Message type NMEA
    put_uint8_slBuffer(body,  1, messageID);
    put_uint8_slBuffer(body,  2, 0x00);             //  other ports
    put_uint8_slBuffer(body,  3, (enable) ? 1 : 0); //  Serial port
    put_uint8_slBuffer(body,  4, 0x00);             //  other ports
    put_uint8_slBuffer(body,  5, 0x00);             //  other ports
    put_uint8_slBuffer(body,  6, 0x00);             //  other ports
    put_uint8_slBuffer(body,  7, 0x00);             //  other ports
    ubxMsg nmeaMsg = createUbxMsg(ut_CFG_MSG, body);

    // now send it, and wait for our ack...
    slReturn nmeaResp = sendUbxAckedMsg(fdPort, nmeaMsg);
    if (isErrorReturn(nmeaResp))
        return makeErrorMsgReturn(ERR_CAUSE(nmeaResp), "failed to enable /disable NMEA MSG");

    free(body);

    return makeOkReturn();
}